

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          StringTree *params_1,StringTree *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,StringTree *params_8,
          ArrayPtr<const_char> *params_9,ArrayPtr<const_char> *params_10,
          ArrayPtr<const_char> *params_11,StringTree *params_12,ArrayPtr<const_char> *params_13,
          ArrayPtr<const_char> *params_14,ArrayPtr<const_char> *params_15,StringTree *params_16,
          ArrayPtr<const_char> *params_17,ArrayPtr<const_char> *params_18,
          ArrayPtr<const_char> *params_19,ArrayPtr<const_char> *params_20,
          ArrayPtr<const_char> *params_21,StringTree *params_22)

{
  ArrayPtr<const_char> *rest_3;
  size_t sVar1;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  char *pos;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  Array<kj::StringTree::Branch> local_128;
  StringTree *local_110;
  StringTree *local_108;
  StringTree *local_100;
  StringTree *local_f8;
  ArrayPtr<const_char> *local_f0;
  char *local_e8;
  char *local_e0;
  size_t sStack_d8;
  char *local_d0;
  size_t sStack_c8;
  size_t local_c0;
  size_t sStack_b8;
  size_t local_b0;
  char *local_a8;
  char *local_a0;
  size_t sStack_98;
  size_t local_90;
  char *local_88;
  char *local_80;
  size_t sStack_78;
  size_t local_70;
  char *local_68;
  char *local_60;
  size_t sStack_58;
  size_t local_50;
  size_t sStack_48;
  size_t local_40;
  char *local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_e8 = (this->text).content.ptr;
  local_e0 = params->ptr;
  sStack_d8 = params_1->size_;
  local_d0 = (params_2->text).content.ptr;
  sStack_c8 = params_3->size_;
  local_c0 = params_4->size_;
  sStack_b8 = params_5->size_;
  local_b0 = params_6->size_;
  local_a8 = params_7->ptr;
  local_a0 = (params_8->text).content.ptr;
  sStack_98 = params_9->size_;
  local_90 = params_10->size_;
  local_88 = params_11->ptr;
  local_80 = (params_12->text).content.ptr;
  sStack_78 = params_13->size_;
  local_70 = params_14->size_;
  local_68 = params_15->ptr;
  local_60 = (params_16->text).content.ptr;
  sStack_58 = params_17->size_;
  local_50 = params_18->size_;
  sStack_48 = params_19->size_;
  local_40 = params_20->size_;
  local_38 = params_21->ptr;
  nums._M_len = (size_type)params;
  nums._M_array = (iterator)0x17;
  local_108 = (StringTree *)params;
  local_100 = params_1;
  local_f0 = params_3;
  sVar1 = _::sum((_ *)&local_e8,nums);
  rest_3 = local_f0;
  __return_storage_ptr__->size_ = sVar1;
  local_e8 = (this->text).content.ptr;
  local_e0 = (char *)0x0;
  sStack_d8 = 0;
  local_d0 = (params_2->text).content.ptr;
  sStack_c8 = local_f0->size_;
  local_c0 = params_4->size_;
  sStack_b8 = params_5->size_;
  local_b0 = params_6->size_;
  local_a8 = (char *)0x0;
  local_a0 = (params_8->text).content.ptr;
  sStack_98 = params_9->size_;
  local_90 = params_10->size_;
  local_88 = (char *)0x0;
  local_80 = (params_12->text).content.ptr;
  sStack_78 = params_13->size_;
  local_70 = params_14->size_;
  local_68 = (char *)0x0;
  local_60 = (params_16->text).content.ptr;
  sStack_58 = params_17->size_;
  local_50 = params_18->size_;
  sStack_48 = params_19->size_;
  local_40 = params_20->size_;
  local_38 = (char *)0x0;
  nums_00._M_len = extraout_RDX;
  nums_00._M_array = (iterator)0x17;
  local_110 = this;
  local_f8 = params_2;
  sVar1 = _::sum((_ *)&local_e8,nums_00);
  heapString((String *)&local_128,sVar1);
  Array<char>::operator=(&(__return_storage_ptr__->text).content,(Array<char> *)&local_128);
  Array<char>::~Array((Array<char> *)&local_128);
  local_e8 = (char *)0x0;
  local_e0 = (char *)0x1;
  sStack_d8 = 1;
  local_d0 = (char *)0x0;
  sStack_c8 = 0;
  local_c0 = 0;
  sStack_b8 = 0;
  local_b0 = 0;
  local_a8 = (char *)0x1;
  local_a0 = (char *)0x0;
  sStack_98 = 0;
  local_90 = 0;
  local_88 = (char *)0x1;
  local_70 = 0;
  local_80 = (char *)0x0;
  sStack_78 = 0;
  local_68 = (char *)0x1;
  local_60 = (char *)0x0;
  sStack_58 = 0;
  local_50 = 0;
  sStack_48 = 0;
  local_40 = 0;
  local_38 = (char *)0x1;
  nums_01._M_len = extraout_RDX_00;
  nums_01._M_array = (iterator)0x17;
  sVar1 = _::sum((_ *)&local_e8,nums_01);
  local_128.ptr = _::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar1);
  local_128.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_128.size_ = sVar1;
  Array<kj::StringTree::Branch>::operator=(&__return_storage_ptr__->branches,&local_128);
  Array<kj::StringTree::Branch>::~Array(&local_128);
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree>
            (__return_storage_ptr__,pos,0,(ArrayPtr<const_char> *)local_110,local_108,local_100,
             (ArrayPtr<const_char> *)local_f8,rest_3,params_4,params_5,params_6,
             (StringTree *)params_7,(ArrayPtr<const_char> *)params_8,params_9,params_10,
             (StringTree *)params_11,(ArrayPtr<const_char> *)params_12,params_13,params_14,
             (StringTree *)params_15,(ArrayPtr<const_char> *)params_16,params_17,params_18,params_19
             ,params_20,(StringTree *)params_21);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}